

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::deleteRenderbuffer(ReferenceContext *this,Renderbuffer *renderbuffer)

{
  Framebuffer *pFVar1;
  Framebuffer *pFVar2;
  Framebuffer *pFVar3;
  int iVar4;
  int iVar5;
  int point;
  long lVar6;
  Attachment *attachment;
  bool bVar7;
  
  if (this->m_renderbufferBinding == renderbuffer) {
    (*(this->super_Context)._vptr_Context[0xc])(this,0x8d41,0);
  }
  iVar4 = 0;
  do {
    pFVar1 = *(Framebuffer **)((this->m_clearColor).m_data + (ulong)(iVar4 != 0) * 2 + -0x1a);
    if (pFVar1 != (Framebuffer *)0x0) {
      pFVar2 = this->m_drawFramebufferBinding;
      pFVar3 = this->m_readFramebufferBinding;
      lVar6 = 0;
      do {
        if (pFVar1->m_attachments[lVar6].name == (renderbuffer->super_NamedObject).m_name) {
          attachment = pFVar1->m_attachments + lVar6;
          for (iVar5 = (uint)(pFVar1 == pFVar3) + (uint)(pFVar1 == pFVar2); iVar5 != 0;
              iVar5 = iVar5 + -1) {
            releaseFboAttachmentReference(this,attachment);
          }
          attachment->type = ATTACHMENTTYPE_LAST;
          attachment->name = 0;
          attachment->texTarget = TEXTARGET_LAST;
          attachment->level = 0;
          attachment->layer = 0;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
    }
    bVar7 = iVar4 == 0;
    iVar4 = iVar4 + 1;
  } while (bVar7);
  rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference(&this->m_renderbuffers,renderbuffer);
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffer (Renderbuffer* renderbuffer)
{
	if (m_renderbufferBinding == renderbuffer)
		bindRenderbuffer(GL_RENDERBUFFER, 0);

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == renderbuffer->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(renderbuffer->getRefCount() == 1);
	m_renderbuffers.releaseReference(renderbuffer);
}